

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

void Sfm_NtkDeleteObj_rec(Sfm_Ntk_t *p,int iNode)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int RetValue;
  int iFanin;
  int i;
  int iNode_local;
  Sfm_Ntk_t *p_local;
  
  iVar1 = Sfm_ObjFanoutNum(p,iNode);
  if (((iVar1 < 1) && (iVar1 = Sfm_ObjIsPi(p,iNode), iVar1 == 0)) &&
     (iVar1 = Sfm_ObjIsFixed(p,iNode), iVar1 == 0)) {
    iVar1 = Sfm_ObjIsNode(p,iNode);
    if (iVar1 == 0) {
      __assert_fail("Sfm_ObjIsNode(p, iNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmNtk.c"
                    ,0x11d,"void Sfm_NtkDeleteObj_rec(Sfm_Ntk_t *, int)");
    }
    for (RetValue = 0; iVar1 = Sfm_ObjFaninNum(p,iNode), RetValue < iVar1; RetValue = RetValue + 1)
    {
      iVar1 = Sfm_ObjFanin(p,iNode,RetValue);
      pVVar3 = Sfm_ObjFoArray(p,iVar1);
      iVar2 = Vec_IntRemove(pVVar3,iNode);
      if (iVar2 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmNtk.c"
                      ,0x120,"void Sfm_NtkDeleteObj_rec(Sfm_Ntk_t *, int)");
      }
      Sfm_NtkDeleteObj_rec(p,iVar1);
    }
    pVVar3 = Sfm_ObjFiArray(p,iNode);
    Vec_IntClear(pVVar3);
    Vec_WrdWriteEntry(p->vTruths,iNode,0);
  }
  return;
}

Assistant:

void Sfm_NtkDeleteObj_rec( Sfm_Ntk_t * p, int iNode )
{
    int i, iFanin;
    if ( Sfm_ObjFanoutNum(p, iNode) > 0 || Sfm_ObjIsPi(p, iNode) || Sfm_ObjIsFixed(p, iNode) )
        return;
    assert( Sfm_ObjIsNode(p, iNode) );
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
    {
        int RetValue = Vec_IntRemove( Sfm_ObjFoArray(p, iFanin), iNode );  assert( RetValue );
        Sfm_NtkDeleteObj_rec( p, iFanin );
    }
    Vec_IntClear( Sfm_ObjFiArray(p, iNode) );
    Vec_WrdWriteEntry( p->vTruths, iNode, (word)0 );
}